

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashrate.cpp
# Opt level: O3

void __thiscall xmrig::Hashrate::~Hashrate(Hashrate *this)

{
  ulong uVar1;
  
  if (this->m_threads != 0) {
    uVar1 = 0;
    do {
      if (this->m_counts[uVar1] != (uint64_t *)0x0) {
        operator_delete__(this->m_counts[uVar1]);
      }
      if (this->m_timestamps[uVar1] != (uint64_t *)0x0) {
        operator_delete__(this->m_timestamps[uVar1]);
      }
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->m_threads);
  }
  if (this->m_counts != (uint64_t **)0x0) {
    operator_delete__(this->m_counts);
  }
  if (this->m_timestamps != (uint64_t **)0x0) {
    operator_delete__(this->m_timestamps);
  }
  if (this->m_top != (uint32_t *)0x0) {
    operator_delete__(this->m_top);
    return;
  }
  return;
}

Assistant:

xmrig::Hashrate::~Hashrate()
{
    for (size_t i = 0; i < m_threads; i++) {
        delete [] m_counts[i];
        delete [] m_timestamps[i];
    }

    delete [] m_counts;
    delete [] m_timestamps;
    delete [] m_top;
}